

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

byte * __thiscall
Js::ByteCodeBufferReader::ReadConstantsTable
          (ByteCodeBufferReader *this,byte *current,FunctionBody *function)

{
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  RegSlot RVar4;
  undefined4 *puVar5;
  double local_60;
  double value_3;
  int8 value_2;
  int16 value_1;
  Var pvStack_50;
  int value;
  Var callsite;
  LPCOLESTR pOStack_40;
  uint32 len_1;
  LPCWSTR string_1;
  LPCOLESTR pOStack_30;
  uint32 len;
  LPCWSTR string;
  byte ct;
  FunctionBody *pFStack_20;
  RegSlot reg;
  FunctionBody *function_local;
  byte *current_local;
  ByteCodeBufferReader *this_local;
  
  pFStack_20 = function;
  function_local = (FunctionBody *)current;
  current_local = (byte *)this;
  FunctionBody::CreateConstantTable(function);
  string._4_4_ = 2;
  do {
    uVar2 = string._4_4_;
    RVar4 = FunctionBody::GetConstantCount(pFStack_20);
    if (RVar4 <= uVar2) {
      return (byte *)function_local;
    }
    function_local =
         (FunctionBody *)ReadByte(this,(byte *)function_local,(byte *)((long)&string + 3));
    switch(string._3_1_) {
    case 1:
      function_local =
           (FunctionBody *)ReadByte(this,(byte *)function_local,(byte *)((long)&value_3 + 1));
      FunctionBody::RecordIntConstant(pFStack_20,string._4_4_,(int)value_3._1_1_);
      break;
    case 2:
      function_local =
           (FunctionBody *)
           ReadConstantSizedInt16(this,(byte *)function_local,(int16 *)((long)&value_3 + 2));
      FunctionBody::RecordIntConstant(pFStack_20,string._4_4_,(int)value_3._2_2_);
      break;
    case 3:
      function_local =
           (FunctionBody *)
           ReadConstantSizedInt32(this,(byte *)function_local,(int *)((long)&value_3 + 4));
      FunctionBody::RecordIntConstant(pFStack_20,string._4_4_,value_3._4_4_);
      break;
    case 4:
      function_local = (FunctionBody *)ReadDouble(this,(byte *)function_local,&local_60);
      FunctionBody::RecordFloatConstant(pFStack_20,string._4_4_,local_60);
      break;
    case 5:
      function_local =
           (FunctionBody *)
           ReadStringConstant(this,(byte *)function_local,pFStack_20,&stack0xffffffffffffffd0,
                              (uint32 *)((long)&string_1 + 4));
      FunctionBody::RecordStrConstant(pFStack_20,string._4_4_,pOStack_30,string_1._4_4_,false);
      break;
    case 6:
      function_local =
           (FunctionBody *)
           ReadStringConstant(this,(byte *)function_local,pFStack_20,&stack0xffffffffffffffc0,
                              (uint32 *)((long)&callsite + 4));
      FunctionBody::RecordStrConstant(pFStack_20,string._4_4_,pOStack_40,callsite._4_4_,true);
      break;
    case 7:
      FunctionBody::RecordNullObject(pFStack_20,string._4_4_);
      break;
    case 8:
      FunctionBody::RecordUndefinedObject(pFStack_20,string._4_4_);
      break;
    case 9:
      FunctionBody::RecordNullDisplayConstant(pFStack_20,string._4_4_);
      break;
    case 10:
      FunctionBody::RecordStrictNullDisplayConstant(pFStack_20,string._4_4_);
      break;
    case 0xb:
      FunctionBody::RecordTrueObject(pFStack_20,string._4_4_);
      break;
    case 0xc:
      FunctionBody::RecordFalseObject(pFStack_20,string._4_4_);
      break;
    case 0xd:
      pvStack_50 = (Var)0x0;
      function_local =
           (FunctionBody *)
           ReadStringTemplateCallsiteConstant
                     (this,(byte *)function_local,pFStack_20,&stack0xffffffffffffffb0);
      FunctionBody::RecordConstant(pFStack_20,string._4_4_,pvStack_50);
      break;
    default:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0xd61,"((0))","Unexpected object type in ReadConstantsTable");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    string._4_4_ = string._4_4_ + 1;
  } while( true );
}

Assistant:

const byte * ReadConstantsTable(const byte * current, FunctionBody * function)
    {
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int constant;
        current = ReadInt32(current, &constant);
        Assert(constant == magicStartOfConstantTable);
#endif

        function->CreateConstantTable();

        for (auto reg = FunctionBody::FirstRegSlot + 1; reg < function->GetConstantCount(); reg++) // Ignore first slot, it is always global or module root and has been preinitialized.
        {
            byte ct;
            current = ReadByte(current, &ct);
            switch(ct)
            {
            case ctString16:
                {
                    LPCWSTR string;
                    uint32 len;
                    current = ReadStringConstant(current, function, &string, &len);

                    function->RecordStrConstant(reg, string, len, false);
                    break;
                }
            case ctPropertyString16:
                {
                    LPCWSTR string;
                    uint32 len;
                    current = ReadStringConstant(current, function, &string, &len);

                    function->RecordStrConstant(reg, string, len, true);
                    break;
                }
            case ctStringTemplateCallsite:
                {
                    Var callsite = nullptr;
                    current = ReadStringTemplateCallsiteConstant(current, function, callsite);

                    function->RecordConstant(reg, callsite);
                    break;
                }
            case ctInt32:
                {
                    int value;
                    current = ReadConstantSizedInt32(current, &value);
                    function->RecordIntConstant(reg, value);
                    break;
                }
            case ctInt16:
                {
                    int16 value;
                    current = ReadConstantSizedInt16(current, &value);
                    function->RecordIntConstant(reg, value);
                    break;
                }
            case ctInt8:
                {
                    int8 value;
                    current = ReadByte(current, (byte *)&value);
                    function->RecordIntConstant(reg, value);
                    break;
                }
            case ctNull:
                function->RecordNullObject(reg);
                break;
            case ctUndefined:
                function->RecordUndefinedObject(reg);
                break;
            case ctNumber:
                {
                    double value;
                    current = ReadDouble(current, &value);
                    function->RecordFloatConstant(reg, value);
                    break;
                }
            case ctNullDisplay:
                function->RecordNullDisplayConstant(reg);
                break;
            case ctStrictNullDisplay:
                function->RecordStrictNullDisplayConstant(reg);
                break;
            case ctTrue:
                function->RecordTrueObject(reg);
                break;
            case ctFalse:
                function->RecordFalseObject(reg);
                break;
            default:
                AssertMsg(UNREACHED, "Unexpected object type in ReadConstantsTable");
                break;
            }
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        current = ReadInt32(current, &constant);
        Assert(constant == magicEndOfConstantTable);
#endif

        return current;
    }